

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

void __thiscall
CVmObjHTTPRequest::reload_from_image(CVmObjHTTPRequest *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  
  (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,this);
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  (this->super_CVmObject).ext_ = pcVar2;
  return;
}

Assistant:

void CVmObjHTTPRequest::reload_from_image(VMG_ vm_obj_id_t self,
                                          const char *ptr, size_t siz)
{
    /* load our image data */
    load_image_data(vmg_ ptr, siz);
}